

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_html.c
# Opt level: O2

int mpt_color_html(mpt_color *color,char *txt)

{
  mpt_color *col_00;
  int iVar1;
  int *piVar2;
  uint8_t *puVar3;
  ulong uVar4;
  bool bVar5;
  uint8_t col [4];
  char local_3c;
  char local_3b;
  undefined1 local_3a;
  char local_39;
  mpt_color *local_38;
  
  col[0] = '\0';
  col[1] = '\0';
  col[2] = '\0';
  col[3] = 0xff;
  if (txt == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -2;
  }
  else {
    local_3a = 0;
    local_39 = '\x04';
    puVar3 = col;
    uVar4 = 0;
    local_38 = color;
    while (col_00 = local_38, bVar5 = local_39 != '\0', local_39 = local_39 + -1, bVar5) {
      local_3c = txt[uVar4];
      if (local_3c == '\0') {
        uVar4 = (ulong)((int)uVar4 + 1);
        break;
      }
      local_3b = txt[uVar4 + 1];
      if (local_3b == '\0') {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        return -1;
      }
      iVar1 = mpt_cuint8(puVar3,&local_3c,0x10,0);
      if (iVar1 < 0) {
        return -1;
      }
      uVar4 = uVar4 + 2;
      puVar3 = puVar3 + 1;
    }
    iVar1 = (int)uVar4;
    if (local_38 != (mpt_color *)0x0) {
      mpt_color_set(local_38,(uint)col & 0xff,(uint)col >> 8 & 0xff,(uint)col >> 0x10 & 0xff);
      mpt_color_setalpha(col_00,(uint)col >> 0x18);
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_color_html(MPT_STRUCT(color) *color, const char *txt)
{
	uint8_t	col[4] = { 0, 0, 0, 255 };
	char	part[4];
	int	len, i = 0;
	
	if (!txt) {
		errno = EINVAL; return -2;
	}
	part[2] = '\0';
	part[3] = 4;
	len = 0;
	
	while (part[3]--) {
		if (!(part[0] = txt[len++]))
			break;
		
		if (!(part[1] = txt[len++])) {
			errno = EINVAL; return -1;
		}
		if (mpt_cuint8(&col[i++], part, 0x10, 0) < 0)
			return -1;
	}
	if (color) {
		mpt_color_set(color, col[0], col[1], col[2]);
		mpt_color_setalpha(color, col[3]);
	}
	return len;
}